

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O2

void __thiscall
QStringMatcher::QStringMatcher(QStringMatcher *this,QString *pattern,CaseSensitivity cs)

{
  char16_t *pcVar1;
  
  this->d_ptr = (QStringMatcherPrivate *)0x0;
  this->q_cs = cs;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->q_pattern).d,&pattern->d);
  memset(this->q_skiptable,0,0x100);
  pcVar1 = (this->q_pattern).d.ptr;
  (this->q_sv).m_size = (this->q_pattern).d.size;
  (this->q_sv).m_data = pcVar1;
  updateSkipTable(this);
  return;
}

Assistant:

QStringMatcher::QStringMatcher(const QString &pattern, Qt::CaseSensitivity cs)
    : d_ptr(nullptr), q_cs(cs), q_pattern(pattern)
{
    q_sv = q_pattern;
    updateSkipTable();
}